

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

mg_point_3d * mg_point_3d_make(uint16_t srid,double x_longitude,double y_latitude,double z_height)

{
  mg_point_3d *pmVar1;
  
  pmVar1 = mg_point_3d_alloc(&mg_system_allocator);
  if (pmVar1 != (mg_point_3d *)0x0) {
    pmVar1->srid = (ulong)srid;
    pmVar1->x = x_longitude;
    pmVar1->y = y_latitude;
    pmVar1->z = z_height;
  }
  return pmVar1;
}

Assistant:

mg_point_3d *mg_point_3d_make(uint16_t srid, double x_longitude,
                              double y_latitude, double z_height) {
  mg_point_3d *point = mg_point_3d_alloc(&mg_system_allocator);
  if (!point) {
    return NULL;
  }
  point->srid = srid;
  point->x = x_longitude;
  point->y = y_latitude;
  point->z = z_height;
  ;
  return point;
}